

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcLoadModuleByBinary(char *module,char *binary)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *copy;
  char *pos;
  char path [1024];
  undefined1 local_40 [8];
  TraceScope traceScope;
  char *binary_local;
  char *module_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    module_local._7_1_ = '\0';
  }
  else {
    if ((nullcLoadModuleByBinary::token == '\0') &&
       (iVar2 = __cxa_guard_acquire(&nullcLoadModuleByBinary::token), iVar2 != 0)) {
      nullcLoadModuleByBinary::token = NULLC::TraceGetToken("nullc","nullcLoadModuleByBinary");
      __cxa_guard_release(&nullcLoadModuleByBinary::token);
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcLoadModuleByBinary::token);
    NULLC::TraceLabel(module);
    sVar3 = strlen(module);
    if (sVar3 < 0x201) {
      strcpy((char *)&pos,module);
      ppcVar1 = &pos;
      while (copy = (char *)ppcVar1, *copy != '\0') {
        ppcVar1 = (char **)(copy + 1);
        if (*copy == '.') {
          *copy = '/';
        }
      }
      strcat((char *)&pos,".nc");
      pcVar4 = BinaryCache::GetBytecode((char *)&pos);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)(*(code *)NULLC::alloc)(*(undefined4 *)binary);
        memcpy(pcVar4,binary,(ulong)*(uint *)binary);
        BinaryCache::PutBytecode((char *)&pos,pcVar4,(Lexeme *)0x0,0);
        module_local._7_1_ = '\x01';
      }
      else {
        NULLC::nullcLastError = "ERROR: module already loaded";
        module_local._7_1_ = '\0';
      }
    }
    else {
      NULLC::nullcLastError = "ERROR: module name is too long";
      module_local._7_1_ = '\0';
    }
    path[0x3fc] = '\x01';
    path[0x3fd] = '\0';
    path[0x3fe] = '\0';
    path[0x3ff] = '\0';
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  return module_local._7_1_;
}

Assistant:

nullres nullcLoadModuleByBinary(const char* module, const char* binary)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLoadModuleByBinary");
	TRACE_LABEL(module);

	if(strlen(module) > 512)
	{
		nullcLastError = "ERROR: module name is too long";
		return false;
	}

	char	path[1024];
	strcpy(path, module);
	char	*pos = path;
	while(*pos)
		if(*pos++ == '.')
			pos[-1] = '/';
	strcat(path, ".nc");

	if(BinaryCache::GetBytecode(path))
	{
		nullcLastError = "ERROR: module already loaded";
		return false;
	}
	// Duplicate binary
	char *copy = (char*)NULLC::alloc(((ByteCode*)binary)->size);
	memcpy(copy, binary, ((ByteCode*)binary)->size);
	binary = copy;
	// Load it into cache
	BinaryCache::PutBytecode(path, binary, NULL, 0);
	return 1;
}